

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void * roaring_bitmap_aligned_malloc(size_t alignment,size_t size)

{
  int iVar1;
  void *in_RAX;
  void *p;
  void *local_8;
  
  local_8 = in_RAX;
  iVar1 = posix_memalign(&local_8,alignment,size);
  if (iVar1 != 0) {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static void* roaring_bitmap_aligned_malloc(size_t alignment, size_t size) {
    void* p;
#ifdef _MSC_VER
    p = _aligned_malloc(size, alignment);
#elif defined(__MINGW32__) || defined(__MINGW64__)
    p = __mingw_aligned_malloc(size, alignment);
#else
    // somehow, if this is used before including "x86intrin.h", it creates an
    // implicit defined warning.
    if (posix_memalign(&p, alignment, size) != 0) return NULL;
#endif
    return p;
}